

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptual_linear_predictive_coefficients_analysis.cc
# Opt level: O1

void __thiscall
sptk::PerceptualLinearPredictiveCoefficientsAnalysis::PerceptualLinearPredictiveCoefficientsAnalysis
          (PerceptualLinearPredictiveCoefficientsAnalysis *this,int fft_length,int num_channel,
          int num_order,int liftering_coefficient,double compression_factor,double sampling_rate,
          double lowest_frequency,double highest_frequency,double floor)

{
  ulong uVar1;
  pointer pdVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  vector<double,_std::allocator<double>_> center_frequencies;
  vector<double,_std::allocator<double>_> local_48;
  
  this->_vptr_PerceptualLinearPredictiveCoefficientsAnalysis =
       (_func_int **)&PTR__PerceptualLinearPredictiveCoefficientsAnalysis_00119628;
  this->liftering_coefficient_ = liftering_coefficient;
  this->compression_factor_ = compression_factor;
  MelFilterBankAnalysis::MelFilterBankAnalysis
            (&this->mel_filter_bank_analysis_,fft_length,num_channel,sampling_rate,lowest_frequency,
             highest_frequency,floor,true);
  InverseFourierTransform::InverseFourierTransform
            (&this->inverse_fourier_transform_,
             (this->mel_filter_bank_analysis_).num_channel_ * 2 + 2);
  LevinsonDurbinRecursion::LevinsonDurbinRecursion(&this->levinson_durbin_recursion_,num_order);
  LinearPredictiveCoefficientsToCepstrum::LinearPredictiveCoefficientsToCepstrum
            (&this->linear_predictive_coefficients_to_cepstrum_,num_order,num_order);
  this->is_valid_ = true;
  (this->equal_loudness_curve_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->equal_loudness_curve_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->equal_loudness_curve_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cepstal_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cepstal_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cepstal_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((((num_order < num_channel) && (0 < this->liftering_coefficient_)) &&
      (0.0 < this->compression_factor_)) && ((this->mel_filter_bank_analysis_).is_valid_ == true)) {
    iVar4 = (*((this->inverse_fourier_transform_).inverse_fourier_transform_)->
              _vptr_FourierTransformInterface[3])();
    if ((((char)iVar4 != '\0') && ((this->levinson_durbin_recursion_).is_valid_ == true)) &&
       ((this->linear_predictive_coefficients_to_cepstrum_).is_valid_ != false)) {
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar3 = MelFilterBankAnalysis::GetCenterFrequencies
                        (&this->mel_filter_bank_analysis_,&local_48);
      if (bVar3) {
        std::vector<double,_std::allocator<double>_>::resize
                  (&this->equal_loudness_curve_,(long)num_channel);
        if (0 < num_channel) {
          pdVar2 = (this->equal_loudness_curve_).super__Vector_base<double,_std::allocator<double>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = 0;
          do {
            dVar6 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5] *
                    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5];
            dVar7 = dVar6 / (dVar6 + 160000.0);
            pdVar2[uVar5] = ((dVar6 + 1440000.0) * dVar7 * dVar7) / (dVar6 + 9610000.0);
            uVar5 = uVar5 + 1;
          } while ((uint)num_channel != uVar5);
        }
        std::vector<double,_std::allocator<double>_>::resize
                  (&this->cepstal_weights_,(long)num_order);
        if (0 < num_order) {
          pdVar2 = (this->cepstal_weights_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar5 = 0;
          do {
            uVar1 = uVar5 + 1;
            iVar4 = this->liftering_coefficient_;
            dVar6 = sin(((double)(int)uVar1 * 3.141592653589793) / (double)iVar4);
            pdVar2[uVar5] = dVar6 * (double)iVar4 * 0.5 + 1.0;
            uVar5 = uVar1;
          } while ((uint)num_order != uVar1);
        }
      }
      else {
        this->is_valid_ = false;
      }
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return;
      }
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      return;
    }
  }
  this->is_valid_ = false;
  return;
}

Assistant:

PerceptualLinearPredictiveCoefficientsAnalysis::
    PerceptualLinearPredictiveCoefficientsAnalysis(
        int fft_length, int num_channel, int num_order,
        int liftering_coefficient, double compression_factor,
        double sampling_rate, double lowest_frequency, double highest_frequency,
        double floor)
    : liftering_coefficient_(liftering_coefficient),
      compression_factor_(compression_factor),
      mel_filter_bank_analysis_(fft_length, num_channel, sampling_rate,
                                lowest_frequency, highest_frequency, floor,
                                true),
      inverse_fourier_transform_(2 * GetNumChannel() + 2),
      levinson_durbin_recursion_(num_order),
      linear_predictive_coefficients_to_cepstrum_(num_order, num_order),
      is_valid_(true) {
  if (num_channel <= num_order || liftering_coefficient_ <= 0 ||
      compression_factor_ <= 0.0 || !mel_filter_bank_analysis_.IsValid() ||
      !inverse_fourier_transform_.IsValid() ||
      !levinson_durbin_recursion_.IsValid() ||
      !linear_predictive_coefficients_to_cepstrum_.IsValid()) {
    is_valid_ = false;
    return;
  }

  std::vector<double> center_frequencies;
  if (!mel_filter_bank_analysis_.GetCenterFrequencies(&center_frequencies)) {
    is_valid_ = false;
    return;
  }

  equal_loudness_curve_.resize(num_channel);
  double* e(&(equal_loudness_curve_[0]));
  for (int m(0); m < num_channel; ++m) {
    const double f1(center_frequencies[m] * center_frequencies[m]);
    const double f2(f1 / (f1 + 1.6e5));
    e[m] = f2 * f2 * (f1 + 1.44e6) / (f1 + 9.61e6);
  }

  cepstal_weights_.resize(num_order);
  double* w(&(cepstal_weights_[0]));
  for (int m(0); m < num_order; ++m) {
    const double theta(sptk::kPi * (m + 1) / liftering_coefficient_);
    w[m] = 1.0 + 0.5 * liftering_coefficient_ * std::sin(theta);
  }
}